

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O2

APInt __thiscall llvm::APInt::rotr(APInt *this,uint rotateAmt)

{
  uint in_EDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar1;
  undefined4 in_register_00000034;
  APInt AVar2;
  APInt AStack_48;
  APInt local_38;
  
  if (in_EDX % ((APInt *)CONCAT44(in_register_00000034,rotateAmt))->BitWidth == 0) {
    APInt(this,(APInt *)CONCAT44(in_register_00000034,rotateAmt));
    uVar1 = extraout_RDX_00;
  }
  else {
    lshr(&local_38,rotateAmt);
    shl(&AStack_48,rotateAmt);
    operator|((llvm *)this,&local_38,&AStack_48);
    ~APInt(&AStack_48);
    ~APInt(&local_38);
    uVar1 = extraout_RDX;
  }
  AVar2._8_8_ = uVar1;
  AVar2.U.pVal = (uint64_t *)this;
  return AVar2;
}

Assistant:

APInt APInt::rotr(unsigned rotateAmt) const {
  rotateAmt %= BitWidth;
  if (rotateAmt == 0)
    return *this;
  return lshr(rotateAmt) | shl(BitWidth - rotateAmt);
}